

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

int loadSettings(Settings *s,json *inj,string *fjson)

{
  string *this;
  bool bVar1;
  __type_conflict _Var2;
  Sampling SVar3;
  int iVar4;
  key_type *pkVar5;
  time_t tVar6;
  reference pbVar7;
  ostream *poVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  double dVar10;
  byte local_1021;
  string local_a60;
  string local_a40;
  string local_a20;
  int local_9fc;
  undefined1 auStack_9f8 [4];
  int io;
  char *local_9f0;
  _Put_time<char> local_9e8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  tm local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  tm local_8c0;
  string local_888;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_868;
  string local_858;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_838;
  string local_828;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_808;
  string local_7f8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_7d8;
  string local_7c8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_7a8;
  string local_798;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_778;
  string local_768;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_748;
  string local_738;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_718;
  string local_708;
  string local_6e8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_6c8;
  string local_6b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_698;
  string local_688;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_668;
  string local_658;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8;
  string local_588;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_568;
  string local_558;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_538;
  string local_528;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_508;
  iterator local_4f8;
  undefined1 local_4d8 [8];
  iterator it;
  undefined1 local_4b0 [8];
  string mapTypeId;
  undefined1 local_488 [8];
  string beforeId;
  undefined1 local_460 [8];
  string afterId;
  undefined1 local_438 [8];
  string typeId;
  undefined1 local_410 [8];
  string kernelId;
  undefined1 local_3e8 [8];
  string gaussianAmpId;
  undefined1 local_3c0 [8];
  string invertMapId;
  undefined1 local_398 [8];
  string imapId;
  undefined1 local_370 [8];
  string allCmapsId;
  undefined1 local_348 [8];
  string cmapNameId;
  undefined1 local_320 [8];
  string cmapFileId;
  undefined1 local_2f8 [8];
  string fgpxId;
  undefined1 local_2d0 [8];
  string fnameId;
  undefined1 local_2a8 [8];
  string fitnyId;
  undefined1 local_280 [8];
  string fitnxId;
  undefined1 local_258 [8];
  string fityId;
  undefined1 local_230 [8];
  string fitxId;
  undefined1 local_208 [8];
  string marginId;
  undefined1 local_1e0 [8];
  string maxyId;
  undefined1 local_1b8 [8];
  string maxxId;
  undefined1 local_190 [8];
  string minyId;
  undefined1 local_168 [8];
  string minxId;
  undefined1 local_140 [8];
  string radiusId;
  undefined1 local_118 [8];
  string sampleId;
  undefined1 local_f0 [8];
  string verbId;
  undefined1 local_c8 [8];
  string sizeyId;
  undefined1 local_a0 [8];
  string sizexId;
  bool bmaxy;
  bool bmaxx;
  bool bminy;
  bool bminx;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string cmapName;
  string *fjson_local;
  json *inj_local;
  Settings *s_local;
  
  s->nx = 0x500;
  s->ny = 0x2d0;
  s->verb = 0;
  s->sampling = autosample;
  s->r = 10;
  s->minx = 0.0;
  s->miny = 0.0;
  s->maxx = 0.0;
  s->maxy = 0.0;
  s->margin = 0.0;
  s->fitx = false;
  s->fity = false;
  s->fitnx = false;
  s->fitny = false;
  std::__cxx11::string::find_last_of((char *)fjson,0x187f55);
  this = (string *)(cmapName.field_2._M_local_buf + 8);
  std::__cxx11::string::substr((ulong)this,(ulong)fjson);
  std::__cxx11::string::operator=((string *)&s->fname,this);
  std::__cxx11::string::~string(this);
  std::__cxx11::string::operator=((string *)&s->fgpx,"*.gpx");
  std::__cxx11::string::operator=((string *)&s->cmapFile,"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"",&local_69);
  std::allocator<char>::~allocator(&local_69);
  s->allCmaps = false;
  s->gka = 10.0;
  s->kernel = cone;
  s->filterType = false;
  s->filterAfter = false;
  s->after = 0;
  s->filterBefore = false;
  s->before = 0;
  s->mapType = heat;
  sizexId.field_2._M_local_buf[0xb] = '\0';
  sizexId.field_2._M_local_buf[10] = '\0';
  sizexId.field_2._M_local_buf[9] = '\0';
  sizexId.field_2._M_local_buf[8] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"Image size x",
             (allocator<char> *)(sizeyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(sizeyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"Image size y",
             (allocator<char> *)(verbId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(verbId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"Verbosity",(allocator<char> *)(sampleId.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(sampleId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"Sampling",(allocator<char> *)(radiusId.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(radiusId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"Kernel radius",
             (allocator<char> *)(minxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(minxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168,"Min x",(allocator<char> *)(minyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(minyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"Min y",(allocator<char> *)(maxxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(maxxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Max x",(allocator<char> *)(maxyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(maxyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e0,"Max y",(allocator<char> *)(marginId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(marginId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,"Margin",(allocator<char> *)(fitxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fitxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_230,"Fit x",(allocator<char> *)(fityId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fityId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_258,"Fit y",(allocator<char> *)(fitnxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fitnxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_280,"Fit nx",(allocator<char> *)(fitnyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fitnyId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2a8,"Fit ny",(allocator<char> *)(fnameId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fnameId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"File name prefix",
             (allocator<char> *)(fgpxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fgpxId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"GPX files",
             (allocator<char> *)(cmapFileId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(cmapFileId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_320,"Colormap file",
             (allocator<char> *)(cmapNameId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(cmapNameId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"Colormap name",
             (allocator<char> *)(allCmapsId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(allCmapsId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_370,"All colormaps",
             (allocator<char> *)(imapId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(imapId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"Color map",
             (allocator<char> *)(invertMapId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(invertMapId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c0,"Invert color map",
             (allocator<char> *)(gaussianAmpId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(gaussianAmpId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3e8,"Gaussian amplitude",
             (allocator<char> *)(kernelId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(kernelId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"Kernel",(allocator<char> *)(typeId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(typeId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_438,"Type",(allocator<char> *)(afterId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(afterId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_460,"After",(allocator<char> *)(beforeId.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(beforeId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_488,"Before",(allocator<char> *)(mapTypeId.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(mapTypeId.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4b0,"Map type",
             (allocator<char> *)((long)&it.m_it.primitive_iterator.m_it + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it.m_it.primitive_iterator.m_it + 7));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((iterator *)local_4d8,inj);
  while( true ) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end(&local_4f8,inj);
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8,&local_4f8);
    if (!bVar1) break;
    pkVar5 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_4d8);
    _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0);
    if (_Var2) {
      pbVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::is_number(pbVar7);
      if (!bVar1) goto LAB_0010bc0d;
      pbVar7 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
      iVar4 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator_int<int,_0>(pbVar7);
      s->nx = iVar4;
    }
    else {
LAB_0010bc0d:
      pkVar5 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_4d8);
      _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_c8);
      if (_Var2) {
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_4d8);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_number(pbVar7);
        if (bVar1) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          iVar4 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator_int<int,_0>(pbVar7);
          s->ny = iVar4;
          goto LAB_0010d975;
        }
      }
      pkVar5 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_4d8);
      _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_f0);
      if (_Var2) {
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_4d8);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_number(pbVar7);
        if (bVar1) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          iVar4 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator_int<int,_0>(pbVar7);
          s->verb = iVar4;
          goto LAB_0010d975;
        }
      }
      pkVar5 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_4d8);
      _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_118);
      if (_Var2) {
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_4d8);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_number(pbVar7);
        if (!bVar1) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (!bVar1) goto LAB_0010c0e7;
        }
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_4d8);
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::is_number(pbVar7);
        if (bVar1) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          SVar3 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator_Sampling<Sampling,_0>(pbVar7);
          s->sampling = SVar3;
        }
        else {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          getSamplingName_abi_cxx11_(&local_528,pointwise);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_508,&local_528);
          bVar1 = nlohmann::operator==(pbVar7,&local_508);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_508);
          std::__cxx11::string::~string((string *)&local_528);
          if (bVar1) {
            s->sampling = pointwise;
          }
          else {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            getSamplingName_abi_cxx11_(&local_558,linear);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_538,&local_558);
            bVar1 = nlohmann::operator==(pbVar7,&local_538);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&local_538);
            std::__cxx11::string::~string((string *)&local_558);
            if (bVar1) {
              s->sampling = linear;
            }
            else {
              pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_4d8);
              getSamplingName_abi_cxx11_(&local_588,autosample);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_568,&local_588);
              bVar1 = nlohmann::operator==(pbVar7,&local_568);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_568);
              std::__cxx11::string::~string((string *)&local_588);
              if (bVar1) {
                s->sampling = autosample;
              }
              else {
                poVar8 = std::operator<<((ostream *)&std::cout,"\nWarning:  unknown sampling value "
                                        );
                pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_4d8);
                poVar8 = nlohmann::operator<<(poVar8,pbVar7);
                poVar8 = std::operator<<(poVar8,", defaulting to \"");
                getSamplingName_abi_cxx11_(&local_5a8,autosample);
                poVar8 = std::operator<<(poVar8,(string *)&local_5a8);
                std::operator<<(poVar8,"\"\n");
                std::__cxx11::string::~string((string *)&local_5a8);
              }
            }
          }
        }
      }
      else {
LAB_0010c0e7:
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_140);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            iVar4 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_int<int,_0>(pbVar7);
            s->r = iVar4;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_168);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            dVar10 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator_double<double,_0>(pbVar7);
            s->minx = dVar10;
            sizexId.field_2._M_local_buf[0xb] = '\x01';
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_190);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            dVar10 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator_double<double,_0>(pbVar7);
            s->miny = dVar10;
            sizexId.field_2._M_local_buf[10] = '\x01';
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1b8);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            dVar10 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator_double<double,_0>(pbVar7);
            s->maxx = dVar10;
            sizexId.field_2._M_local_buf[9] = '\x01';
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1e0);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            dVar10 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator_double<double,_0>(pbVar7);
            s->maxy = dVar10;
            sizexId.field_2._M_local_buf[8] = '\x01';
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_208);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            dVar10 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator_double<double,_0>(pbVar7);
            s->margin = dVar10;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_230);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_boolean(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_bool<bool,_0>(pbVar7);
            s->fitx = bVar1;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_258);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_boolean(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_bool<bool,_0>(pbVar7);
            s->fity = bVar1;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_280);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_boolean(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_bool<bool,_0>(pbVar7);
            s->fitnx = bVar1;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2a8);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_boolean(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_bool<bool,_0>(pbVar7);
            s->fitny = bVar1;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2d0);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_5c8,pbVar7);
            std::__cxx11::string::operator=((string *)&s->fname,(string *)&local_5c8);
            std::__cxx11::string::~string((string *)&local_5c8);
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2f8);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_5e8,pbVar7);
            std::__cxx11::string::operator=((string *)&s->fgpx,(string *)&local_5e8);
            std::__cxx11::string::~string((string *)&local_5e8);
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_320);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_608,pbVar7);
            std::__cxx11::string::operator=((string *)&s->cmapFile,(string *)&local_608);
            std::__cxx11::string::~string((string *)&local_608);
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_348);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_628,pbVar7);
            std::__cxx11::string::operator=((string *)local_68,(string *)&local_628);
            std::__cxx11::string::~string((string *)&local_628);
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_398);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            iVar4 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_int<int,_0>(pbVar7);
            (s->c).imap = iVar4;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_3c0);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_boolean(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_bool<bool,_0>(pbVar7);
            (s->c).inv = bVar1;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_370);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_boolean(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator_bool<bool,_0>(pbVar7);
            s->allCmaps = bVar1;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_3e8);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_number(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            dVar10 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator_double<double,_0>(pbVar7);
            s->gka = dVar10;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_410);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            getKernelName_abi_cxx11_(&local_658,pyramid);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_638,&local_658);
            bVar1 = nlohmann::operator==(pbVar7,&local_638);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&local_638);
            std::__cxx11::string::~string((string *)&local_658);
            if (bVar1) {
              s->kernel = pyramid;
            }
            else {
              pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_4d8);
              getKernelName_abi_cxx11_(&local_688,cylinder);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_668,&local_688);
              bVar1 = nlohmann::operator==(pbVar7,&local_668);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_668);
              std::__cxx11::string::~string((string *)&local_688);
              if (bVar1) {
                s->kernel = cylinder;
              }
              else {
                pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_4d8);
                getKernelName_abi_cxx11_(&local_6b8,gaussian);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_698,&local_6b8);
                bVar1 = nlohmann::operator==(pbVar7,&local_698);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&local_698);
                std::__cxx11::string::~string((string *)&local_6b8);
                if (bVar1) {
                  s->kernel = gaussian;
                }
                else {
                  pbVar7 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_4d8);
                  getKernelName_abi_cxx11_(&local_6e8,cone);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::
                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_6c8,&local_6e8);
                  bVar1 = nlohmann::operator==(pbVar7,&local_6c8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json(&local_6c8);
                  std::__cxx11::string::~string((string *)&local_6e8);
                  if (bVar1) {
                    s->kernel = cone;
                  }
                  else {
                    poVar8 = std::operator<<((ostream *)&std::cout,
                                             "\nWarning:  unknown kernel value ");
                    pbVar7 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)local_4d8);
                    poVar8 = nlohmann::operator<<(poVar8,pbVar7);
                    poVar8 = std::operator<<(poVar8,", defaulting to \"");
                    getKernelName_abi_cxx11_(&local_708,cone);
                    poVar8 = std::operator<<(poVar8,(string *)&local_708);
                    std::operator<<(poVar8,"\"\n");
                    std::__cxx11::string::~string((string *)&local_708);
                  }
                }
              }
            }
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_438);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            s->filterType = true;
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            getTypeName_abi_cxx11_(&local_738,hike);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_718,&local_738);
            bVar1 = nlohmann::operator==(pbVar7,&local_718);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&local_718);
            std::__cxx11::string::~string((string *)&local_738);
            if (bVar1) {
              s->type = hike;
            }
            else {
              pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_4d8);
              getTypeName_abi_cxx11_(&local_768,nordicSki);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_748,&local_768);
              bVar1 = nlohmann::operator==(pbVar7,&local_748);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_748);
              std::__cxx11::string::~string((string *)&local_768);
              if (bVar1) {
                s->type = nordicSki;
              }
              else {
                pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_4d8);
                getTypeName_abi_cxx11_(&local_798,ride);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_778,&local_798);
                bVar1 = nlohmann::operator==(pbVar7,&local_778);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&local_778);
                std::__cxx11::string::~string((string *)&local_798);
                if (bVar1) {
                  s->type = ride;
                }
                else {
                  pbVar7 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_4d8);
                  getTypeName_abi_cxx11_(&local_7c8,run);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::
                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_7a8,&local_7c8);
                  bVar1 = nlohmann::operator==(pbVar7,&local_7a8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json(&local_7a8);
                  std::__cxx11::string::~string((string *)&local_7c8);
                  if (bVar1) {
                    s->type = run;
                  }
                  else {
                    pbVar7 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)local_4d8);
                    getTypeName_abi_cxx11_(&local_7f8,walk);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::
                    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_7d8,&local_7f8);
                    bVar1 = nlohmann::operator==(pbVar7,&local_7d8);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::~basic_json(&local_7d8);
                    std::__cxx11::string::~string((string *)&local_7f8);
                    if (bVar1) {
                      s->type = walk;
                    }
                    else {
                      s->filterType = false;
                      poVar8 = std::operator<<((ostream *)&std::cout,
                                               "\nWarning:  unknown type value ");
                      pbVar7 = nlohmann::detail::
                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)local_4d8);
                      poVar8 = nlohmann::operator<<(poVar8,pbVar7);
                      std::operator<<(poVar8,", defaulting to all activity types.\n");
                    }
                  }
                }
              }
            }
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_4b0);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            getMapTypeName_abi_cxx11_(&local_828,elevation);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_808,&local_828);
            bVar1 = nlohmann::operator==(pbVar7,&local_808);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json(&local_808);
            std::__cxx11::string::~string((string *)&local_828);
            if (bVar1) {
              s->mapType = elevation;
            }
            else {
              pbVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_4d8);
              getMapTypeName_abi_cxx11_(&local_858,gradient);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_838,&local_858);
              bVar1 = nlohmann::operator==(pbVar7,&local_838);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_838);
              std::__cxx11::string::~string((string *)&local_858);
              if (bVar1) {
                s->mapType = gradient;
              }
              else {
                pbVar7 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_4d8);
                getMapTypeName_abi_cxx11_(&local_888,heat);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_868,&local_888);
                bVar1 = nlohmann::operator==(pbVar7,&local_868);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&local_868);
                std::__cxx11::string::~string((string *)&local_888);
                if (bVar1) {
                  s->mapType = heat;
                }
                else {
                  poVar8 = std::operator<<((ostream *)&std::cout,
                                           "\nWarning:  unknown map type value ");
                  pbVar7 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_4d8);
                  poVar8 = nlohmann::operator<<(poVar8,pbVar7);
                  std::operator<<(poVar8,", defaulting to heat map.\n");
                }
              }
            }
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_460);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            s->filterAfter = true;
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_8e0,pbVar7);
            str2tm(&local_8c0,&local_8e0);
            memcpy(&s->aftertm,&local_8c0,0x38);
            std::__cxx11::string::~string((string *)&local_8e0);
            tVar6 = mktime((tm *)&s->aftertm);
            s->after = tVar6;
            goto LAB_0010d975;
          }
        }
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        _Var2 = std::operator==(pkVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_488);
        if (_Var2) {
          pbVar7 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_4d8);
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pbVar7);
          if (bVar1) {
            s->filterBefore = true;
            pbVar7 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_4d8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_938,pbVar7);
            str2tm(&local_918,&local_938);
            memcpy(&s->beforetm,&local_918,0x38);
            std::__cxx11::string::~string((string *)&local_938);
            tVar6 = mktime((tm *)&s->beforetm);
            s->before = tVar6;
            goto LAB_0010d975;
          }
        }
        poVar8 = std::operator<<((ostream *)&std::cout,"\nWarning:  unknown JSON key \"");
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_4d8);
        poVar8 = std::operator<<(poVar8,(string *)pkVar5);
        poVar8 = std::operator<<(poVar8,"\" with value \"");
        pbVar7 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_4d8);
        poVar8 = nlohmann::operator<<(poVar8,pbVar7);
        std::operator<<(poVar8,"\"\n");
      }
    }
LAB_0010d975:
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_958,
                 (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_4d8,0);
  }
  local_1021 = 0;
  if ((((sizexId.field_2._M_local_buf[0xb] & 1U) != 0) &&
      (local_1021 = 0, (sizexId.field_2._M_local_buf[10] & 1U) != 0)) &&
     (local_1021 = 0, (sizexId.field_2._M_local_buf[9] & 1U) != 0)) {
    local_1021 = sizexId.field_2._M_local_buf[8];
  }
  s->fit = (bool)((local_1021 ^ 0xff) & 1);
  if (s->mapType != heat) {
    s->sampling = linear;
    s->kernel = cylinder;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,"Image size");
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,s->nx);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,s->ny);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_2d0);
  poVar8 = std::operator<<(poVar8," = \"");
  poVar8 = std::operator<<(poVar8,(string *)&s->fname);
  std::operator<<(poVar8,"\"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_2f8);
  poVar8 = std::operator<<(poVar8," = \"");
  poVar8 = std::operator<<(poVar8,(string *)&s->fgpx);
  std::operator<<(poVar8,"\"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_320);
  poVar8 = std::operator<<(poVar8," = \"");
  poVar8 = std::operator<<(poVar8,(string *)&s->cmapFile);
  std::operator<<(poVar8,"\"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_348);
  poVar8 = std::operator<<(poVar8," = \"");
  poVar8 = std::operator<<(poVar8,(string *)local_68);
  std::operator<<(poVar8,"\"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_370);
  poVar8 = std::operator<<(poVar8," = \"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)(s->allCmaps & 1));
  std::operator<<(poVar8,"\"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_398);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(s->c).imap);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_3c0);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)((s->c).inv & 1));
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_f0);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,s->verb);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_118);
  poVar8 = std::operator<<(poVar8," = ");
  getSamplingName_abi_cxx11_(&local_978,s->sampling);
  poVar8 = std::operator<<(poVar8,(string *)&local_978);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string((string *)&local_978);
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_140);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,s->r);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_3e8);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,s->gka);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_410);
  poVar8 = std::operator<<(poVar8," = ");
  getKernelName_abi_cxx11_(&local_998,s->kernel);
  poVar8 = std::operator<<(poVar8,(string *)&local_998);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string((string *)&local_998);
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_208);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,s->margin);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_230);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)(s->fitx & 1));
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_258);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)(s->fity & 1));
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_280);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)(s->fitnx & 1));
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_2a8);
  poVar8 = std::operator<<(poVar8," = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)(s->fitny & 1));
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_4b0);
  poVar8 = std::operator<<(poVar8," = ");
  getMapTypeName_abi_cxx11_(&local_9b8,s->mapType);
  poVar8 = std::operator<<(poVar8,(string *)&local_9b8);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string((string *)&local_9b8);
  if ((s->filterType & 1U) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_438);
    poVar8 = std::operator<<(poVar8," = ");
    getTypeName_abi_cxx11_(&local_9d8,s->type);
    poVar8 = std::operator<<(poVar8,(string *)&local_9d8);
    std::operator<<(poVar8,"\n");
    std::__cxx11::string::~string((string *)&local_9d8);
  }
  if ((s->filterAfter & 1U) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_460);
    poVar8 = std::operator<<(poVar8," = ");
    local_9e8 = std::put_time<char>(&s->aftertm,"%c");
    pbVar9 = std::operator<<(poVar8,local_9e8);
    std::operator<<(pbVar9,"\n");
  }
  if ((s->filterBefore & 1U) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_488);
    poVar8 = std::operator<<(poVar8," = ");
    _auStack_9f8 = std::put_time<char>(&s->beforetm,"%c");
    pbVar9 = std::operator<<(poVar8,_auStack_9f8);
    std::operator<<(pbVar9,"\n");
  }
  if ((s->fit & 1U) == 0) {
    printBounds(s);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator!=(&s->cmapFile,"");
  if (bVar1) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"");
    if ((bVar1) || ((s->allCmaps & 1U) != 0)) {
      if ((s->allCmaps & 1U) == 0) {
        std::__cxx11::string::string((string *)&local_a40,(string *)&s->cmapFile);
        std::__cxx11::string::string((string *)&local_a60,(string *)local_68);
        local_9fc = irwincolor::Map::load(&s->c,&local_a40,&local_a60);
        std::__cxx11::string::~string((string *)&local_a60);
        std::__cxx11::string::~string((string *)&local_a40);
      }
      else {
        std::__cxx11::string::string((string *)&local_a20,(string *)&s->cmapFile);
        local_9fc = irwincolor::loadMapNames(&local_a20,&s->mapNames);
        std::__cxx11::string::~string((string *)&local_a20);
      }
      if (local_9fc != 0) {
        s_local._4_4_ = local_9fc;
        goto LAB_0010e740;
      }
    }
  }
  s_local._4_4_ = 0;
LAB_0010e740:
  std::__cxx11::string::~string((string *)local_4b0);
  std::__cxx11::string::~string((string *)local_488);
  std::__cxx11::string::~string((string *)local_460);
  std::__cxx11::string::~string((string *)local_438);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)local_3e8);
  std::__cxx11::string::~string((string *)local_3c0);
  std::__cxx11::string::~string((string *)local_398);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::string::~string((string *)local_320);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  return s_local._4_4_;
}

Assistant:

int loadSettings(Settings& s, json& inj, std::string& fjson)
{
	// Initial defaults
	s.nx = 1280;
	s.ny = 720;
	s.verb = 0;
	s.sampling = autosample;
	s.r = 10;
	s.minx = 0.0;
	s.miny = 0.0;
	s.maxx = 0.0;
	s.maxy = 0.0;
	s.margin = 0.0;
	s.fitx = false;
	s.fity = false;
	s.fitnx = false;
	s.fitny = false;
	s.fname = fjson.substr(0, fjson.find_last_of("."));
	s.fgpx = "*.gpx";
	s.cmapFile = "";
	std::string cmapName = "";
	s.allCmaps = false;
	s.gka = 10.0;
	s.kernel = cone;
	s.filterType = false;
	s.filterAfter = false;
	s.after = 0;
	s.filterBefore = false;
	s.before = 0;
	s.mapType = heat;

	bool bminx = false, bminy = false, bmaxx = false, bmaxy = false;

	// JSON keys
	const std::string sizexId = "Image size x";
	const std::string sizeyId = "Image size y";
	const std::string verbId = "Verbosity";
	const std::string sampleId = "Sampling";
	const std::string radiusId = "Kernel radius";
	const std::string minxId = "Min x";
	const std::string minyId = "Min y";
	const std::string maxxId = "Max x";
	const std::string maxyId = "Max y";
	const std::string marginId = "Margin";
	const std::string fitxId = "Fit x";
	const std::string fityId = "Fit y";
	const std::string fitnxId = "Fit nx";
	const std::string fitnyId = "Fit ny";
	const std::string fnameId = "File name prefix";
	const std::string fgpxId = "GPX files";
	const std::string cmapFileId = "Colormap file";
	const std::string cmapNameId = "Colormap name";
	const std::string allCmapsId = "All colormaps";
	const std::string imapId = "Color map";
	const std::string invertMapId = "Invert color map";
	const std::string gaussianAmpId = "Gaussian amplitude";
	const std::string kernelId = "Kernel";
	const std::string typeId = "Type";
	const std::string afterId = "After";
	const std::string beforeId = "Before";
	const std::string mapTypeId = "Map type";

	for (json::iterator it = inj.begin(); it != inj.end(); it++)
	{
		//std::cout << "\nkey = " << it.key();
		if (it.key() == sizexId && it.value().is_number())
		{
			s.nx = it.value();
		}
		else if (it.key() == sizeyId && it.value().is_number())
		{
			s.ny = it.value();
		}
		else if (it.key() == verbId && it.value().is_number())
		{
			s.verb = it.value();
		}
		else if (it.key() == sampleId
				&& (it.value().is_number() || it.value().is_string()))
		{
			if (it.value().is_number())
				s.sampling = it.value();
			else
			{
				if (it.value() == getSamplingName(pointwise))
					s.sampling = pointwise;
				else if (it.value() == getSamplingName(linear))
					s.sampling = linear;
				else if (it.value() == getSamplingName(autosample))
					s.sampling = autosample;
				else
					std::cout << "\nWarning:  unknown sampling value "
							<< it.value() << ", defaulting to \""
							<< getSamplingName(autosample) << "\"\n";
			}
		}
		else if (it.key() == radiusId && it.value().is_number())
		{
			s.r = it.value();
		}
		else if (it.key() == minxId && it.value().is_number())
		{
			s.minx = it.value();
			bminx = true;
		}
		else if (it.key() == minyId && it.value().is_number())
		{
			s.miny = it.value();
			bminy = true;
		}
		else if (it.key() == maxxId && it.value().is_number())
		{
			s.maxx = it.value();
			bmaxx = true;
		}
		else if (it.key() == maxyId && it.value().is_number())
		{
			s.maxy = it.value();
			bmaxy = true;
		}
		else if (it.key() == marginId && it.value().is_number())
		{
			s.margin = it.value();
		}
		else if (it.key() == fitxId && it.value().is_boolean())
		{
			s.fitx = it.value();
		}
		else if (it.key() == fityId && it.value().is_boolean())
		{
			s.fity = it.value();
		}
		else if (it.key() == fitnxId && it.value().is_boolean())
		{
			s.fitnx = it.value();
		}
		else if (it.key() == fitnyId && it.value().is_boolean())
		{
			s.fitny = it.value();
		}
		else if (it.key() == fnameId && it.value().is_string())
		{
			s.fname = it.value();
		}
		else if (it.key() == fgpxId && it.value().is_string())
		{
			s.fgpx = it.value();
		}
		else if (it.key() == cmapFileId && it.value().is_string())
		{
			s.cmapFile = it.value();
		}
		else if (it.key() == cmapNameId && it.value().is_string())
		{
			cmapName = it.value();
		}
		else if (it.key() == imapId && it.value().is_number())
		{
			s.c.imap = it.value();
		}
		else if (it.key() == invertMapId && it.value().is_boolean())
		{
			s.c.inv = it.value();
		}
		else if (it.key() == allCmapsId && it.value().is_boolean())
		{
			s.allCmaps = it.value();
		}
		else if (it.key() == gaussianAmpId && it.value().is_number())
		{
			s.gka = it.value();
		}
		else if (it.key() == kernelId && it.value().is_string())
		{
			if (it.value() == getKernelName(pyramid))
				s.kernel = pyramid;
			else if (it.value() == getKernelName(cylinder))
				s.kernel = cylinder;
			else if (it.value() == getKernelName(gaussian))
				s.kernel = gaussian;
			else if (it.value() == getKernelName(cone))
				s.kernel = cone;
			else
				std::cout << "\nWarning:  unknown kernel value "
						<< it.value() << ", defaulting to \""
						<< getKernelName(cone) << "\"\n";
		}
		else if (it.key() == typeId && it.value().is_string())
		{
			s.filterType = true;
			if (it.value() == getTypeName(hike))
				s.type = hike;
			else if (it.value() == getTypeName(nordicSki))
				s.type = nordicSki;
			else if (it.value() == getTypeName(ride))
				s.type = ride;
			else if (it.value() == getTypeName(run))
				s.type = run;
			else if (it.value() == getTypeName(walk))
				s.type = walk;
			else
			{
				s.filterType = false;
				std::cout << "\nWarning:  unknown type value "
						<< it.value() << ", defaulting to all activity types.\n";
			}
		}
		else if (it.key() == mapTypeId && it.value().is_string())
		{
			if (it.value() == getMapTypeName(elevation))
				s.mapType = elevation;
			else if (it.value() == getMapTypeName(gradient))
				s.mapType = gradient;
			else if (it.value() == getMapTypeName(heat))
				s.mapType = heat;
			else
			{
				std::cout << "\nWarning:  unknown map type value "
						<< it.value() << ", defaulting to heat map.\n";
			}
		}
		else if (it.key() == afterId && it.value().is_string())
		{
			s.filterAfter = true;
			s.aftertm = str2tm((std::string) it.value());
			s.after = mktime(&s.aftertm);
		}
		else if (it.key() == beforeId && it.value().is_string())
		{
			s.filterBefore = true;
			s.beforetm = str2tm((std::string) it.value());
			s.before = mktime(&s.beforetm);
		}
		else
		{
			std::cout << "\nWarning:  unknown JSON key \"" << it.key()
					<< "\" with value \"" << it.value() << "\"\n";
		}
	}

	s.fit = !(bminx && bminy && bmaxx && bmaxy);

	if (s.mapType != heat)
	{
		// Linear sampling, cylinder kernel only for non-heat maps
		s.sampling = linear;
		s.kernel = cylinder;
	}

	// Echo inputs
	std::cout << "\n";
	std::cout << "Image size" << " = " << s.nx << ", " << s.ny << "\n";
	std::cout << fnameId << " = \"" << s.fname << "\"\n";
	std::cout << fgpxId << " = \"" << s.fgpx << "\"\n";
	std::cout << cmapFileId << " = \"" << s.cmapFile << "\"\n";
	std::cout << cmapNameId << " = \"" << cmapName << "\"\n";
	std::cout << allCmapsId << " = \"" << s.allCmaps << "\"\n";
	std::cout << imapId << " = " << s.c.imap << "\n";
	std::cout << invertMapId << " = " << s.c.inv << "\n";
	std::cout << verbId << " = " << s.verb << "\n";
	std::cout << sampleId << " = " << getSamplingName(s.sampling) << "\n";
	std::cout << radiusId << " = " << s.r << "\n";
	std::cout << gaussianAmpId << " = " << s.gka << "\n";
	std::cout << kernelId << " = " << getKernelName(s.kernel) << "\n";
	std::cout << marginId << " = " << s.margin << "\n";
	std::cout << fitxId << " = " << s.fitx << "\n";
	std::cout << fityId << " = " << s.fity << "\n";
	std::cout << fitnxId << " = " << s.fitnx << "\n";
	std::cout << fitnyId << " = " << s.fitny << "\n";
	std::cout << mapTypeId << " = " << getMapTypeName(s.mapType) << "\n";

	if (s.filterType) std::cout << typeId << " = " << getTypeName(s.type) << "\n";

	if (s.filterAfter) std::cout << afterId << " = " << std::put_time(&s.aftertm, "%c") << "\n";
	if (s.filterBefore) std::cout << beforeId << " = " << std::put_time(&s.beforetm, "%c") << "\n";

	//std::cout << "s.fit = " << s.fit << "\n";
	if (!s.fit)
		printBounds(s);

	std::cout << std::endl;

	if (s.cmapFile != "" && (cmapName != "" || s.allCmaps))
	{
		int io;
		if (s.allCmaps)
		{
			io = irwincolor::loadMapNames(s.cmapFile, s.mapNames);
			//std::cout << "mapNames = " << s.mapNames << std::endl;
		}
		else
			io = s.c.load(s.cmapFile, cmapName);
		if (io != 0) return io;
	}
	return 0;
}